

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void SSL_get0_signed_cert_timestamp_list(SSL *ssl,uint8_t **out,size_t *out_len)

{
  bool bVar1;
  SSL_SESSION *pSVar2;
  pointer pcVar3;
  uint8_t *puVar4;
  size_t sVar5;
  SSL_SESSION *session;
  size_t *out_len_local;
  uint8_t **out_local;
  SSL *ssl_local;
  
  pSVar2 = SSL_get_session((SSL *)ssl);
  if ((((ssl->field_0xa4 & 1) == 0) && (pSVar2 != (SSL_SESSION *)0x0)) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr *)(pSVar2->krb5_client_princ + 0x78)), bVar1)) {
    pcVar3 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                        (pSVar2->krb5_client_princ + 0x78));
    puVar4 = CRYPTO_BUFFER_data(pcVar3);
    *out = puVar4;
    pcVar3 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                        (pSVar2->krb5_client_princ + 0x78));
    sVar5 = CRYPTO_BUFFER_len(pcVar3);
    *out_len = sVar5;
    return;
  }
  *out_len = 0;
  *out = (uint8_t *)0x0;
  return;
}

Assistant:

void SSL_get0_signed_cert_timestamp_list(const SSL *ssl, const uint8_t **out,
                                         size_t *out_len) {
  SSL_SESSION *session = SSL_get_session(ssl);
  if (ssl->server || !session || !session->signed_cert_timestamp_list) {
    *out_len = 0;
    *out = NULL;
    return;
  }

  *out = CRYPTO_BUFFER_data(session->signed_cert_timestamp_list.get());
  *out_len = CRYPTO_BUFFER_len(session->signed_cert_timestamp_list.get());
}